

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrEva.c
# Opt level: O1

void Rwr_CutCountNumNodes_rec(Abc_Obj_t *pObj,Cut_Cut_t *pCut,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  void **ppvVar2;
  ulong uVar3;
  int iVar4;
  
  do {
    if (0xfffffff < *(uint *)pCut) {
      uVar3 = 0;
      do {
        if (*(int *)(&pCut[1].field_0x0 + uVar3 * 4) == pObj->Id) {
          if ((*(uint *)&pObj->field_0x14 & 0x40) != 0) {
            return;
          }
          *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | 0x40;
          uVar1 = vNodes->nCap;
          if (vNodes->nSize == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (vNodes->pArray == (void **)0x0) {
                ppvVar2 = (void **)malloc(0x80);
              }
              else {
                ppvVar2 = (void **)realloc(vNodes->pArray,0x80);
              }
              vNodes->pArray = ppvVar2;
              iVar4 = 0x10;
            }
            else {
              iVar4 = uVar1 * 2;
              if (iVar4 <= (int)uVar1) goto LAB_004be8d4;
              if (vNodes->pArray == (void **)0x0) {
                ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar2 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
              }
              vNodes->pArray = ppvVar2;
            }
            vNodes->nCap = iVar4;
          }
LAB_004be8d4:
          iVar4 = vNodes->nSize;
          vNodes->nSize = iVar4 + 1;
          vNodes->pArray[iVar4] = pObj;
          return;
        }
        uVar3 = uVar3 + 1;
      } while (*(uint *)pCut >> 0x1c != uVar3);
    }
    uVar1 = *(uint *)&pObj->field_0x14;
    if ((uVar1 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwr/rwrEva.c"
                    ,0x1aa,"void Rwr_CutCountNumNodes_rec(Abc_Obj_t *, Cut_Cut_t *, Vec_Ptr_t *)");
    }
    if ((uVar1 & 0x40) == 0) {
      *(uint *)&pObj->field_0x14 = uVar1 | 0x40;
      uVar1 = vNodes->nCap;
      if (vNodes->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc(0x80);
          }
          else {
            ppvVar2 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar2;
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar1 * 2;
          if (iVar4 <= (int)uVar1) goto LAB_004be807;
          if (vNodes->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar2 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
          }
          vNodes->pArray = ppvVar2;
        }
        vNodes->nCap = iVar4;
      }
LAB_004be807:
      iVar4 = vNodes->nSize;
      vNodes->nSize = iVar4 + 1;
      vNodes->pArray[iVar4] = pObj;
    }
    Rwr_CutCountNumNodes_rec
              ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],pCut,vNodes);
    pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]];
  } while( true );
}

Assistant:

void Rwr_CutCountNumNodes_rec( Abc_Obj_t * pObj, Cut_Cut_t * pCut, Vec_Ptr_t * vNodes )
{
    int i;
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        if ( pCut->pLeaves[i] == pObj->Id )
        {
            // check if the node is collected
            if ( pObj->fMarkC == 0 )
            {
                pObj->fMarkC = 1;
                Vec_PtrPush( vNodes, pObj );
            }
            return;
        }
    assert( Abc_ObjIsNode(pObj) );
    // check if the node is collected
    if ( pObj->fMarkC == 0 )
    {
        pObj->fMarkC = 1;
        Vec_PtrPush( vNodes, pObj );
    }
    // traverse the fanins
    Rwr_CutCountNumNodes_rec( Abc_ObjFanin0(pObj), pCut, vNodes );
    Rwr_CutCountNumNodes_rec( Abc_ObjFanin1(pObj), pCut, vNodes );
}